

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.h
# Opt level: O2

SequenceFeatureType * __thiscall
CoreML::Specification::FeatureType::mutable_sequencetype(FeatureType *this)

{
  SequenceFeatureType *this_00;
  
  if (this->_oneof_case_[0] == 7) {
    this_00 = (SequenceFeatureType *)(this->Type_).int64type_;
  }
  else {
    clear_Type(this);
    this->_oneof_case_[0] = 7;
    this_00 = (SequenceFeatureType *)operator_new(0x28);
    SequenceFeatureType::SequenceFeatureType(this_00);
    (this->Type_).sequencetype_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::SequenceFeatureType* FeatureType::mutable_sequencetype() {
  if (!has_sequencetype()) {
    clear_Type();
    set_has_sequencetype();
    Type_.sequencetype_ = new ::CoreML::Specification::SequenceFeatureType;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.FeatureType.sequenceType)
  return Type_.sequencetype_;
}